

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OAssign
          (_Type_CLASS_OBJECT *this,Variable *object_target,Variable *object_src)

{
  bool bVar1;
  Object *pOVar2;
  ClassObject *pCVar3;
  Type *pTVar4;
  ClassObject *this_00;
  State *state;
  uint *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar6;
  Variable local_a8;
  Variable local_98;
  undefined1 local_88 [8];
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Callback *call;
  undefined1 local_38 [8];
  Variable v;
  Variable *object_src_local;
  Variable *object_target_local;
  _Type_CLASS_OBJECT *this_local;
  uint *puVar5;
  
  v.nb_ref = in_RCX;
  pOVar2 = Variable::operator->(object_src);
  pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
  if (pCVar3->ClassBase == (Class *)0x0) {
    pOVar2 = Variable::operator->((Variable *)v.nb_ref);
    pTVar4 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar4,(Type *)object_target);
    if (!bVar1) {
      pOVar2 = Variable::operator->(object_src);
      VVar6 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar5 = VVar6.nb_ref;
      goto LAB_0014d002;
    }
    pOVar2 = Variable::operator->((Variable *)v.nb_ref);
    pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    pOVar2 = Variable::operator->(object_src);
    this_00 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    ClassObject::operator=(this_00,pCVar3);
  }
  else {
    pOVar2 = Variable::operator->(object_src);
    pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    Class::GetOperator((Class *)local_38,(OperatorType)pCVar3->ClassBase);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar4 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar4,(Type *)_type_callback);
    if (bVar1) {
      pOVar2 = Variable::operator->(object_src);
      pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
      if (pCVar3->ScriptState == (State *)0x0) {
        pOVar2 = Variable::operator->(object_src);
        Memory::Create((Memory *)this,(Type *)pOVar2->memory);
        bVar1 = true;
      }
      else {
        pOVar2 = Variable::operator->((Variable *)local_38);
        state = (State *)Object::GetData<LiteScript::Callback>(pOVar2);
        Nullable<LiteScript::Variable>::Nullable
                  ((Nullable<LiteScript::Variable> *)
                   &args.
                    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,object_src);
        Nullable<LiteScript::Variable>::operator=
                  ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                   (Nullable<LiteScript::Variable> *)
                   &args.
                    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        Nullable<LiteScript::Variable>::~Nullable
                  ((Nullable<LiteScript::Variable> *)
                   &args.
                    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
        Variable::Variable(&local_98,(Variable *)v.nb_ref);
        std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88,
                   &local_98);
        Variable::~Variable(&local_98);
        pOVar2 = Variable::operator->(object_src);
        pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
        Callback::operator()
                  ((Callback *)this,state,
                   (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                   pCVar3->ScriptState);
        bVar1 = true;
        std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
      }
    }
    else {
      pOVar2 = Variable::operator->((Variable *)v.nb_ref);
      pTVar4 = Object::GetType(pOVar2);
      pOVar2 = Variable::operator*(object_src);
      (*pTVar4->_vptr_Type[1])(pTVar4,pOVar2);
      pOVar2 = Variable::operator->(object_src);
      pTVar4 = Object::GetType(pOVar2);
      (*pTVar4->_vptr_Type[3])(&local_a8,pTVar4,object_src,v.nb_ref);
      Variable::~Variable(&local_a8);
      bVar1 = false;
    }
    Variable::~Variable((Variable *)local_38);
    puVar5 = extraout_RDX;
    if (bVar1) goto LAB_0014d002;
  }
  Variable::Variable((Variable *)this,(Variable *)v.nb_ref);
  puVar5 = extraout_RDX_00;
LAB_0014d002:
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OAssign(Variable &object_target, const Variable &object_src) const {
    if (object_target->GetData<ClassObject>().ClassBase == nullptr) {
        if (object_src->GetType() == *this)
            object_target->GetData<ClassObject>() = object_src->GetData<ClassObject>();
        else
            return object_target->memory.Create(Type::NIL);
    }
    else {
        Variable v = object_target->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_ASSIGN);
        if (v->GetType() == Type::CALLBACK) {
            if (object_target->GetData<ClassObject>().ScriptState == nullptr)
                return object_target->memory.Create(Type::NIL);
            Callback &call = v->GetData<Callback>();
            call.This = Nullable<Variable>(object_target);
            std::vector<Variable> args;
            args.push_back(Variable(object_src));
            return call(*(object_target->GetData<ClassObject>().ScriptState), args);
        } else {
            object_src->GetType().AssignObject(*object_target);
            object_target->GetType().OAssign(object_target, object_src);
        }
    }
    return object_src;
}